

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::relocate
          (QArrayDataPointer<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *this,
          qsizetype offset,pair<QHttpNetworkRequest,_QHttpNetworkReply_*> **data)

{
  bool bVar1;
  pair<QHttpNetworkRequest,_QHttpNetworkReply_*> *in_RDX;
  long in_RSI;
  QArrayDataPointer<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *in_RDI;
  pair<QHttpNetworkRequest,_QHttpNetworkReply_*> **unaff_retaddr;
  pair<QHttpNetworkRequest,_QHttpNetworkReply_*> *res;
  QHttpNetworkRequestPrivate *n;
  QArrayDataPointer<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *c;
  
  n = (QHttpNetworkRequestPrivate *)
      (&(((((QSharedDataPointer<QHttpNetworkRequestPrivate> *)&in_RDI->ptr)->d).ptr)->
        super_QHttpNetworkHeaderPrivate).super_QSharedData + in_RSI * 6);
  c = in_RDI;
  QtPrivate::q_relocate_overlap_n<std::pair<QHttpNetworkRequest,QHttpNetworkReply*>,long_long>
            (in_RDX,(longlong)n,(pair<QHttpNetworkRequest,_QHttpNetworkReply_*> *)in_RDI);
  if ((in_RDX != (pair<QHttpNetworkRequest,_QHttpNetworkReply_*> *)0x0) &&
     (bVar1 = QtPrivate::
              q_points_into_range<QArrayDataPointer<std::pair<QHttpNetworkRequest,QHttpNetworkReply*>>,std::pair<QHttpNetworkRequest,QHttpNetworkReply*>const*>
                        (unaff_retaddr,c), bVar1)) {
    (in_RDX->first).super_QHttpNetworkHeader._vptr_QHttpNetworkHeader =
         (in_RDX->first).super_QHttpNetworkHeader._vptr_QHttpNetworkHeader + in_RSI * 3;
  }
  (((QSharedDataPointer<QHttpNetworkRequestPrivate> *)&in_RDI->ptr)->d).ptr = n;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }